

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

string * testing::internal::FlagToEnvVar_abi_cxx11_(char *flag)

{
  char cVar1;
  Message *this;
  string *in_RDI;
  size_t i;
  size_type sVar2;
  Message env_var;
  string full_flag;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  char *local_38;
  string local_30;
  
  Message::Message((Message *)&local_40);
  std::operator<<((ostream *)(local_40.ptr_ + 0x10),"gtest_");
  this = Message::operator<<((Message *)&local_40,&local_38);
  Message::GetString_abi_cxx11_(&local_30,this);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_40);
  Message::Message((Message *)&local_40);
  for (sVar2 = 0; sVar2 != local_30._M_string_length; sVar2 = sVar2 + 1) {
    cVar1 = ToUpper(local_30._M_dataplus._M_p[sVar2]);
    std::operator<<((ostream *)(local_40.ptr_ + 0x10),cVar1);
  }
  StringStreamToString(in_RDI,local_40.ptr_);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_40);
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

static std::string FlagToEnvVar(const char* flag) {
  const std::string full_flag =
      (Message() << GTEST_FLAG_PREFIX_ << flag).GetString();

  Message env_var;
  for (size_t i = 0; i != full_flag.length(); i++) {
    env_var << ToUpper(full_flag.c_str()[i]);
  }

  return env_var.GetString();
}